

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::VersionCompare(CompareOp op,char *lhss,char *rhss)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long rhs;
  unsigned_long lhs;
  char *endr;
  char *endl;
  char *rhss_local;
  char *lhss_local;
  CompareOp op_local;
  
  lhs = (unsigned_long)rhss;
  endr = lhss;
  endl = rhss;
  rhss_local = lhss;
  lhss_local._0_4_ = op;
  while( true ) {
    if (((*endr < '0') || (bVar1 = true, '9' < *endr)) && (bVar1 = false, '/' < *(char *)lhs)) {
      bVar1 = *(char *)lhs < ':';
    }
    if (!bVar1) {
      return (CompareOp)lhss_local == OP_EQUAL;
    }
    uVar2 = strtoul(endr,&endr,10);
    uVar3 = strtoul((char *)lhs,(char **)&lhs,10);
    if (uVar2 < uVar3) {
      return (CompareOp)lhss_local == OP_LESS;
    }
    if (uVar3 < uVar2) break;
    if (*(char *)lhs == '.') {
      lhs = lhs + 1;
    }
    if (*endr == '.') {
      endr = endr + 1;
    }
  }
  return (CompareOp)lhss_local == OP_GREATER;
}

Assistant:

bool cmSystemTools::VersionCompare(cmSystemTools::CompareOp op,
                                   const char* lhss, const char* rhss)
{
  const char *endl = lhss;
  const char *endr = rhss;
  unsigned long lhs, rhs;

  while (((*endl >= '0') && (*endl <= '9')) ||
         ((*endr >= '0') && (*endr <= '9')))
    {
    // Do component-wise comparison.
    lhs = strtoul(endl, const_cast<char**>(&endl), 10);
    rhs = strtoul(endr, const_cast<char**>(&endr), 10);

    if(lhs < rhs)
      {
      // lhs < rhs, so true if operation is LESS
      return op == cmSystemTools::OP_LESS;
      }
    else if(lhs > rhs)
      {
      // lhs > rhs, so true if operation is GREATER
      return op == cmSystemTools::OP_GREATER;
      }

    if (*endr == '.')
      {
      endr++;
      }

    if (*endl == '.')
      {
      endl++;
      }
    }
  // lhs == rhs, so true if operation is EQUAL
  return op == cmSystemTools::OP_EQUAL;
}